

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Glyph * __thiscall
sf::Font::loadGlyph(Font *this,Uint32 codePoint,uint characterSize,bool bold,float outlineThickness)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  value_type vVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  reference pvVar10;
  reference pvVar11;
  undefined4 in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  Font *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  IntRect IVar12;
  uint h;
  uint w;
  uint y;
  uint x;
  size_t index_1;
  uint x_2;
  uint y_2;
  size_t index;
  uint x_1;
  uint y_1;
  Uint8 *pixels;
  Uint8 *end;
  Uint8 *current;
  Page *page;
  uint padding;
  int height;
  int width;
  FT_Bitmap *bitmap;
  FT_Stroker stroker;
  FT_OutlineGlyph outlineGlyph;
  bool outline;
  FT_Pos weight;
  FT_Glyph glyphDesc;
  FT_Int32 flags;
  FT_Face_conflict face;
  Glyph *in_stack_ffffffffffffff10;
  Font *this_00;
  key_type *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  Uint8 *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  long local_98;
  reference local_88;
  undefined8 local_80;
  undefined8 local_78;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar13;
  Font *this_01;
  
  bVar4 = in_R8B & 1;
  this_00 = in_RDI;
  Glyph::Glyph(in_stack_ffffffffffffff10);
  this_01 = (Font *)(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
  if ((this_01 != (Font *)0x0) &&
     (bVar5 = setCurrentSize(this_00,(uint)((ulong)in_RDI >> 0x20)), bVar5)) {
    uVar13 = 0x20;
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      uVar13 = 0x28;
    }
    iVar7 = FT_Load_Char(this_01,in_EDX,uVar13);
    if ((iVar7 == 0) &&
       (iVar7 = FT_Get_Glyph(this_01[1].m_face,&stack0xffffffffffffffd0), iVar7 == 0)) {
      bVar5 = *(int *)(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0) + 0x10) ==
              0x6f75746c;
      if (bVar5) {
        if (bVar4 != 0) {
          FT_Outline_Embolden(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0) + 0x28,
                              0x40);
        }
        if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
          puVar2 = in_RSI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          FT_Stroker_Set(puVar2,(long)(in_XMM0_Da * 64.0),1,0,0);
          FT_Glyph_Stroke(&stack0xffffffffffffffd0,puVar2,1);
        }
      }
      FT_Glyph_To_Bitmap(&stack0xffffffffffffffd0,0,0,1);
      lVar3 = CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      if (!bVar5) {
        if (bVar4 != 0) {
          FT_Bitmap_Embolden((in_RSI->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start,(int *)(lVar3 + 0x30),0x40,
                             0x40);
        }
        if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
          poVar9 = err();
          poVar9 = std::operator<<(poVar9,"Failed to outline glyph (no fallback available)");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
      *(float *)&in_RDI->m_library = (float)*(long *)((long)this_01[1].m_face + 0x50) / 64.0;
      if (bVar4 != 0) {
        *(float *)&in_RDI->m_library = *(float *)&in_RDI->m_library + 1.0;
      }
      iVar7 = *(int *)(lVar3 + 0x34);
      iVar1 = *(int *)(lVar3 + 0x30);
      if ((0 < iVar7) && (0 < iVar1)) {
        iVar8 = iVar7 + 2;
        std::
        map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
        ::operator[]((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
        IVar12 = findGlyphRect(this_01,(Page *)CONCAT44(uVar13,in_stack_ffffffffffffffd8),
                               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
        local_80 = IVar12._0_8_;
        *(undefined8 *)((long)&in_RDI->m_streamRec + 4) = local_80;
        local_78 = IVar12._8_8_;
        *(undefined8 *)((long)&in_RDI->m_stroker + 4) = local_78;
        *(int *)((long)&in_RDI->m_streamRec + 4) = *(int *)((long)&in_RDI->m_streamRec + 4) + 1;
        *(int *)&in_RDI->m_stroker = *(int *)&in_RDI->m_stroker + 1;
        *(int *)((long)&in_RDI->m_stroker + 4) = *(int *)((long)&in_RDI->m_stroker + 4) + -2;
        *(int *)&in_RDI->m_refCount = *(int *)&in_RDI->m_refCount + -2;
        *(float *)((long)&in_RDI->m_library + 4) =
             (float)*(long *)((long)this_01[1].m_face + 0x40) / 64.0;
        *(float *)&in_RDI->m_face = -(float)*(long *)((long)this_01[1].m_face + 0x48) / 64.0;
        *(float *)((long)&in_RDI->m_face + 4) =
             in_XMM0_Da + in_XMM0_Da + (float)*(long *)((long)this_01[1].m_face + 0x30) / 64.0;
        *(float *)&in_RDI->m_streamRec =
             in_XMM0_Da + in_XMM0_Da + (float)*(long *)((long)this_01[1].m_face + 0x38) / 64.0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_RSI,(size_type)this_00);
        local_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (in_RSI + 5,0);
        pvVar10 = local_88 + iVar8 * (iVar1 + 2) * 4;
        while (local_88 != pvVar10) {
          *local_88 = 0xff;
          local_88[1] = 0xff;
          pvVar11 = local_88 + 3;
          local_88[2] = 0xff;
          local_88 = local_88 + 4;
          *pvVar11 = '\0';
        }
        local_98 = *(long *)(lVar3 + 0x40);
        if (*(char *)(lVar3 + 0x4a) == '\x01') {
          for (in_stack_ffffffffffffff64 = 1; in_stack_ffffffffffffff64 < iVar1 + 1U;
              in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
            for (in_stack_ffffffffffffff60 = 1; in_stack_ffffffffffffff60 < iVar7 + 1U;
                in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
              in_stack_ffffffffffffff58 =
                   (Uint8 *)(ulong)(in_stack_ffffffffffffff60 + in_stack_ffffffffffffff64 * iVar8);
              vVar6 = '\0';
              if (((uint)*(byte *)(local_98 + (ulong)(in_stack_ffffffffffffff60 - 1 >> 3)) &
                  1 << (7 - ((char)in_stack_ffffffffffffff60 - 1U & 7) & 0x1f)) != 0) {
                vVar6 = 0xff;
              }
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (in_RSI + 5,(long)in_stack_ffffffffffffff58 * 4 + 3);
              *pvVar10 = vVar6;
            }
            local_98 = local_98 + *(int *)(lVar3 + 0x38);
          }
        }
        else {
          for (in_stack_ffffffffffffff54 = 1; in_stack_ffffffffffffff54 < iVar1 + 1U;
              in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
            for (in_stack_ffffffffffffff50 = 1; in_stack_ffffffffffffff50 < iVar7 + 1U;
                in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1) {
              in_stack_ffffffffffffff48 =
                   (key_type *)
                   (ulong)(in_stack_ffffffffffffff50 + in_stack_ffffffffffffff54 * iVar8);
              vVar6 = *(value_type *)(local_98 + (ulong)(in_stack_ffffffffffffff50 - 1));
              pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (in_RSI + 5,(long)in_stack_ffffffffffffff48 * 4 + 3);
              *pvVar10 = vVar6;
            }
            local_98 = local_98 + *(int *)(lVar3 + 0x38);
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI + 5,0);
        Texture::update((Texture *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                        in_stack_ffffffffffffff50,(uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                        (uint)in_stack_ffffffffffffff48);
      }
      FT_Done_Glyph(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
  }
  return (Glyph *)this_00;
}

Assistant:

Glyph Font::loadGlyph(Uint32 codePoint, unsigned int characterSize, bool bold, float outlineThickness) const
{
    // The glyph to return
    Glyph glyph;

    // First, transform our ugly void* to a FT_Face
    FT_Face face = static_cast<FT_Face>(m_face);
    if (!face)
        return glyph;

    // Set the character size
    if (!setCurrentSize(characterSize))
        return glyph;

    // Load the glyph corresponding to the code point
    FT_Int32 flags = FT_LOAD_TARGET_NORMAL | FT_LOAD_FORCE_AUTOHINT;
    if (outlineThickness != 0)
        flags |= FT_LOAD_NO_BITMAP;
    if (FT_Load_Char(face, codePoint, flags) != 0)
        return glyph;

    // Retrieve the glyph
    FT_Glyph glyphDesc;
    if (FT_Get_Glyph(face->glyph, &glyphDesc) != 0)
        return glyph;

    // Apply bold and outline (there is no fallback for outline) if necessary -- first technique using outline (highest quality)
    FT_Pos weight = 1 << 6;
    bool outline = (glyphDesc->format == FT_GLYPH_FORMAT_OUTLINE);
    if (outline)
    {
        if (bold)
        {
            FT_OutlineGlyph outlineGlyph = (FT_OutlineGlyph)glyphDesc;
            FT_Outline_Embolden(&outlineGlyph->outline, weight);
        }

        if (outlineThickness != 0)
        {
            FT_Stroker stroker = static_cast<FT_Stroker>(m_stroker);

            FT_Stroker_Set(stroker, static_cast<FT_Fixed>(outlineThickness * static_cast<float>(1 << 6)), FT_STROKER_LINECAP_ROUND, FT_STROKER_LINEJOIN_ROUND, 0);
            FT_Glyph_Stroke(&glyphDesc, stroker, true);
        }
    }

    // Convert the glyph to a bitmap (i.e. rasterize it)
    FT_Glyph_To_Bitmap(&glyphDesc, FT_RENDER_MODE_NORMAL, 0, 1);
    FT_Bitmap& bitmap = reinterpret_cast<FT_BitmapGlyph>(glyphDesc)->bitmap;

    // Apply bold if necessary -- fallback technique using bitmap (lower quality)
    if (!outline)
    {
        if (bold)
            FT_Bitmap_Embolden(static_cast<FT_Library>(m_library), &bitmap, weight, weight);

        if (outlineThickness != 0)
            err() << "Failed to outline glyph (no fallback available)" << std::endl;
    }

    // Compute the glyph's advance offset
    glyph.advance = static_cast<float>(face->glyph->metrics.horiAdvance) / static_cast<float>(1 << 6);
    if (bold)
        glyph.advance += static_cast<float>(weight) / static_cast<float>(1 << 6);

    int width  = bitmap.width;
    int height = bitmap.rows;

    if ((width > 0) && (height > 0))
    {
        // Leave a small padding around characters, so that filtering doesn't
        // pollute them with pixels from neighbors
        const unsigned int padding = 1;

        width += 2 * padding;
        height += 2 * padding;

        // Get the glyphs page corresponding to the character size
        Page& page = m_pages[characterSize];

        // Find a good position for the new glyph into the texture
        glyph.textureRect = findGlyphRect(page, width, height);

        // Make sure the texture data is positioned in the center
        // of the allocated texture rectangle
        glyph.textureRect.left += padding;
        glyph.textureRect.top += padding;
        glyph.textureRect.width -= 2 * padding;
        glyph.textureRect.height -= 2 * padding;

        // Compute the glyph's bounding box
        glyph.bounds.left   =  static_cast<float>(face->glyph->metrics.horiBearingX) / static_cast<float>(1 << 6);
        glyph.bounds.top    = -static_cast<float>(face->glyph->metrics.horiBearingY) / static_cast<float>(1 << 6);
        glyph.bounds.width  =  static_cast<float>(face->glyph->metrics.width)        / static_cast<float>(1 << 6) + outlineThickness * 2;
        glyph.bounds.height =  static_cast<float>(face->glyph->metrics.height)       / static_cast<float>(1 << 6) + outlineThickness * 2;

        // Resize the pixel buffer to the new size and fill it with transparent white pixels
        m_pixelBuffer.resize(width * height * 4);

        Uint8* current = &m_pixelBuffer[0];
        Uint8* end = current + width * height * 4;

        while (current != end)
        {
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 255;
            (*current++) = 0;
        }

        // Extract the glyph's pixels from the bitmap
        const Uint8* pixels = bitmap.buffer;
        if (bitmap.pixel_mode == FT_PIXEL_MODE_MONO)
        {
            // Pixels are 1 bit monochrome values
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = ((pixels[(x - padding) / 8]) & (1 << (7 - ((x - padding) % 8)))) ? 255 : 0;
                }
                pixels += bitmap.pitch;
            }
        }
        else
        {
            // Pixels are 8 bits gray levels
            for (unsigned int y = padding; y < height - padding; ++y)
            {
                for (unsigned int x = padding; x < width - padding; ++x)
                {
                    // The color channels remain white, just fill the alpha channel
                    std::size_t index = x + y * width;
                    m_pixelBuffer[index * 4 + 3] = pixels[x - padding];
                }
                pixels += bitmap.pitch;
            }
        }

        // Write the pixels to the texture
        unsigned int x = glyph.textureRect.left - padding;
        unsigned int y = glyph.textureRect.top - padding;
        unsigned int w = glyph.textureRect.width + 2 * padding;
        unsigned int h = glyph.textureRect.height + 2 * padding;
        page.texture.update(&m_pixelBuffer[0], w, h, x, y);
    }

    // Delete the FT glyph
    FT_Done_Glyph(glyphDesc);

    // Done :)
    return glyph;
}